

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O0

void fsnav_linal_uuT(double *res,double *u,size_t n)

{
  ulong local_50;
  size_t r;
  size_t q;
  size_t p;
  size_t k;
  size_t j;
  size_t i;
  size_t n_local;
  double *u_local;
  double *res_local;
  
  p = 0;
  i = n;
  n_local = (size_t)u;
  u_local = res;
  for (j = 0; j < i; j = j + 1) {
    for (k = j; k < i; k = k + 1) {
      fsnav_linal_u_ij2k(&q,k,k,i);
      u_local[p] = *(double *)(n_local + p * 8) * *(double *)(n_local + q * 8);
      local_50 = k;
      r = p;
      while (q = q + 1, r = r + 1, local_50 = local_50 + 1, local_50 < i) {
        u_local[p] = *(double *)(n_local + r * 8) * *(double *)(n_local + q * 8) + u_local[p];
      }
      p = p + 1;
    }
  }
  return;
}

Assistant:

void fsnav_linal_uuT(double* res, double* u, const size_t n)
{
	size_t i, j, k, p, q, r;

	for (i = 0, k = 0; i < n; i++) {
		for (j = i; j < n; j++, k++) {
			fsnav_linal_u_ij2k(&p, j, j, n);
			res[k] = u[k]*u[p];
			for (q = k+1, p++, r = j+1; r < n; q++, p++, r++)
				res[k] += u[q]*u[p];
		}
	}
}